

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bac.h
# Opt level: O0

char * Ptr_SopToTypeName(char *pSop)

{
  int iVar1;
  char *pSop_local;
  
  iVar1 = strcmp(pSop," 0\n");
  if (iVar1 == 0) {
    pSop_local = "BAC_BOX_C0";
  }
  else {
    iVar1 = strcmp(pSop," 1\n");
    if (iVar1 == 0) {
      pSop_local = "BAC_BOX_C1";
    }
    else {
      iVar1 = strcmp(pSop,"1 1\n");
      if (iVar1 == 0) {
        pSop_local = "BAC_BOX_BUF";
      }
      else {
        iVar1 = strcmp(pSop,"0 1\n");
        if (iVar1 == 0) {
          pSop_local = "BAC_BOX_INV";
        }
        else {
          iVar1 = strcmp(pSop,"11 1\n");
          if (iVar1 == 0) {
            pSop_local = "BAC_BOX_AND";
          }
          else {
            iVar1 = strcmp(pSop,"00 1\n");
            if (iVar1 == 0) {
              pSop_local = "BAC_BOX_NOR";
            }
            else {
              iVar1 = strcmp(pSop,"00 0\n");
              if (iVar1 == 0) {
                pSop_local = "BAC_BOX_OR";
              }
              else {
                iVar1 = strcmp(pSop,"-1 1\n1- 1\n");
                if (iVar1 == 0) {
                  pSop_local = "BAC_BOX_OR";
                }
                else {
                  iVar1 = strcmp(pSop,"1- 1\n-1 1\n");
                  if (iVar1 == 0) {
                    pSop_local = "BAC_BOX_OR";
                  }
                  else {
                    iVar1 = strcmp(pSop,"01 1\n10 1\n");
                    if (iVar1 == 0) {
                      pSop_local = "BAC_BOX_XOR";
                    }
                    else {
                      iVar1 = strcmp(pSop,"10 1\n01 1\n");
                      if (iVar1 == 0) {
                        pSop_local = "BAC_BOX_XOR";
                      }
                      else {
                        iVar1 = strcmp(pSop,"11 1\n00 1\n");
                        if (iVar1 == 0) {
                          pSop_local = "BAC_BOX_XNOR";
                        }
                        else {
                          iVar1 = strcmp(pSop,"00 1\n11 1\n");
                          if (iVar1 == 0) {
                            pSop_local = "BAC_BOX_XNOR";
                          }
                          else {
                            iVar1 = strcmp(pSop,"10 1\n");
                            if (iVar1 == 0) {
                              pSop_local = "BAC_BOX_SHARP";
                            }
                            else {
                              iVar1 = strcmp(pSop,"01 1\n");
                              if (iVar1 != 0) {
                                __assert_fail("0",
                                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/bac/bac.h"
                                              ,0x396,"char *Ptr_SopToTypeName(char *)");
                              }
                              pSop_local = "BAC_BOX_SHARPL";
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return pSop_local;
}

Assistant:

static inline char * Ptr_SopToTypeName( char * pSop )
{
    if ( !strcmp(pSop, " 0\n") )         return "BAC_BOX_C0";
    if ( !strcmp(pSop, " 1\n") )         return "BAC_BOX_C1";
    if ( !strcmp(pSop, "1 1\n") )        return "BAC_BOX_BUF";
    if ( !strcmp(pSop, "0 1\n") )        return "BAC_BOX_INV";
    if ( !strcmp(pSop, "11 1\n") )       return "BAC_BOX_AND";
    if ( !strcmp(pSop, "00 1\n") )       return "BAC_BOX_NOR";
    if ( !strcmp(pSop, "00 0\n") )       return "BAC_BOX_OR";
    if ( !strcmp(pSop, "-1 1\n1- 1\n") ) return "BAC_BOX_OR";
    if ( !strcmp(pSop, "1- 1\n-1 1\n") ) return "BAC_BOX_OR";
    if ( !strcmp(pSop, "01 1\n10 1\n") ) return "BAC_BOX_XOR";
    if ( !strcmp(pSop, "10 1\n01 1\n") ) return "BAC_BOX_XOR";
    if ( !strcmp(pSop, "11 1\n00 1\n") ) return "BAC_BOX_XNOR";
    if ( !strcmp(pSop, "00 1\n11 1\n") ) return "BAC_BOX_XNOR";
    if ( !strcmp(pSop, "10 1\n") )       return "BAC_BOX_SHARP";
    if ( !strcmp(pSop, "01 1\n") )       return "BAC_BOX_SHARPL";
    assert( 0 );
    return NULL;
}